

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

void yyDo(GREG *G,yyaction action,int begin,int end,char *name)

{
  int iVar1;
  yythunk *pyVar2;
  int iVar3;
  
  iVar3 = G->thunkpos;
  iVar1 = G->thunkslen;
  while (iVar1 <= iVar3) {
    G->thunkslen = iVar1 * 2;
    pyVar2 = (yythunk *)realloc(G->thunks,(long)(iVar1 * 2) << 5);
    G->thunks = pyVar2;
    iVar3 = G->thunkpos;
    iVar1 = G->thunkslen;
  }
  pyVar2 = G->thunks;
  pyVar2[iVar3].begin = begin;
  pyVar2[iVar3].end = end;
  pyVar2[iVar3].action = action;
  pyVar2[iVar3].name = name;
  G->thunkpos = iVar3 + 1;
  return;
}

Assistant:

YY_LOCAL(void) yyDo(GREG *G, yyaction action, int begin, int end, const char *name)
{
  while (G->thunkpos >= G->thunkslen)
    {
      G->thunkslen *= 2;
      G->thunks= (yythunk*)YY_REALLOC(G->thunks, sizeof(yythunk) * G->thunkslen, G->data);
    }
  G->thunks[G->thunkpos].begin=  begin;
  G->thunks[G->thunkpos].end=    end;
  G->thunks[G->thunkpos].action= action;
  G->thunks[G->thunkpos].name= name;
  ++G->thunkpos;
}